

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# messages.c
# Opt level: O2

void prf_messages_exit(void)

{
  prf_msg_handler_t **pppVar1;
  uint uVar2;
  ulong uVar3;
  ulong uVar4;
  
  uVar2 = prf_array_count(prf_handlers[1]);
  pppVar1 = prf_handlers[1];
  uVar4 = 0;
  uVar3 = (ulong)uVar2;
  if ((int)uVar2 < 1) {
    uVar3 = uVar4;
  }
  for (; uVar3 != uVar4; uVar4 = uVar4 + 1) {
    free(pppVar1[uVar4]);
  }
  prf_array_free(pppVar1);
  uVar2 = prf_array_count(prf_handlers[2]);
  pppVar1 = prf_handlers[2];
  uVar4 = 0;
  uVar3 = (ulong)uVar2;
  if ((int)uVar2 < 1) {
    uVar3 = uVar4;
  }
  for (; uVar3 != uVar4; uVar4 = uVar4 + 1) {
    free(pppVar1[uVar4]);
  }
  prf_array_free(pppVar1);
  uVar2 = prf_array_count(prf_handlers[3]);
  pppVar1 = prf_handlers[3];
  uVar4 = 0;
  uVar3 = (ulong)uVar2;
  if ((int)uVar2 < 1) {
    uVar3 = uVar4;
  }
  for (; uVar3 != uVar4; uVar4 = uVar4 + 1) {
    free(pppVar1[uVar4]);
  }
  prf_array_free(pppVar1);
  uVar2 = prf_array_count(prf_handlers[4]);
  pppVar1 = prf_handlers[4];
  uVar4 = 0;
  uVar3 = (ulong)uVar2;
  if ((int)uVar2 < 1) {
    uVar3 = uVar4;
  }
  for (; uVar3 != uVar4; uVar4 = uVar4 + 1) {
    free(pppVar1[uVar4]);
  }
  prf_array_free(pppVar1);
  uVar2 = prf_array_count(prf_handlers[5]);
  pppVar1 = prf_handlers[5];
  uVar4 = 0;
  uVar3 = (ulong)uVar2;
  if ((int)uVar2 < 1) {
    uVar3 = uVar4;
  }
  for (; uVar3 != uVar4; uVar4 = uVar4 + 1) {
    free(pppVar1[uVar4]);
  }
  prf_array_free(pppVar1);
  return;
}

Assistant:

void
prf_messages_exit(
    void )
{
    int i, count;

    count = prf_array_count( prf_handlers[ PRF_MSG_INFO ] );
    for ( i = 0; i < count; i++ ) {
        if ( prf_handlers[ PRF_MSG_INFO ][ i ] != NULL ) {
            free( prf_handlers[ PRF_MSG_INFO ][ i ] );
        }
    }
    prf_array_free( prf_handlers[ PRF_MSG_INFO ] );

    count = prf_array_count( prf_handlers[ PRF_MSG_DEBUG ] );
    for ( i = 0; i < count; i++ ) {
        if ( prf_handlers[ PRF_MSG_DEBUG ][ i ] != NULL ) {
            free( prf_handlers[ PRF_MSG_DEBUG ][ i ] );
        }
    }
    prf_array_free( prf_handlers[ PRF_MSG_DEBUG ] );

    count = prf_array_count( prf_handlers[ PRF_MSG_WARNING ] );
    for ( i = 0; i < count; i++ ) {
        if ( prf_handlers[ PRF_MSG_WARNING ][ i ] != NULL ) {
            free( prf_handlers[ PRF_MSG_WARNING ][ i ] );
        }
    }
    prf_array_free( prf_handlers[ PRF_MSG_WARNING ] );

    count = prf_array_count( prf_handlers[ PRF_MSG_ERROR ] );
    for ( i = 0; i < count; i++ ) {
        if ( prf_handlers[ PRF_MSG_ERROR ][ i ] != NULL ) {
            free( prf_handlers[ PRF_MSG_ERROR ][ i ] );
        }
    }
    prf_array_free( prf_handlers[ PRF_MSG_ERROR ] );

    count = prf_array_count( prf_handlers[ PRF_MSG_FATAL_ERROR ] );
    for ( i = 0; i < count; i++ ) {
        if ( prf_handlers[ PRF_MSG_FATAL_ERROR ][ i ] != NULL ) {
            free( prf_handlers[ PRF_MSG_FATAL_ERROR ][ i ] );
        }
    }
    prf_array_free( prf_handlers[ PRF_MSG_FATAL_ERROR ] );
}